

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.hpp
# Opt level: O1

bool __thiscall Cube::intersect(Cube *this,Ray *ray,Hit *result)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  
  uVar4._0_4_ = (ray->dir).x;
  uVar4._4_4_ = (ray->dir).y;
  uVar8 = -(uint)(0.0 < (float)(undefined4)uVar4);
  uVar9 = -(uint)(0.0 < (float)uVar4._4_4_);
  uVar2 = (ray->origin).x;
  uVar5 = (ray->origin).y;
  auVar13._0_4_ = (float)(~uVar8 & 0x3f000000 | uVar8 & 0xbf000000) - (float)uVar2;
  auVar13._4_4_ = (float)(~uVar9 & 0x3f000000 | uVar9 & 0xbf000000) - (float)uVar5;
  auVar13._8_8_ = 0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar4;
  auVar14 = divps(auVar13,auVar14);
  fVar12 = auVar14._0_4_;
  fVar15 = auVar14._4_4_;
  fVar11 = 1.0;
  fVar10 = (float)(~-(uint)(fVar12 < fVar15) & 0x3f800000);
  if (fVar15 <= fVar12) {
    fVar11 = 0.0;
    fVar15 = fVar12;
  }
  auVar17._0_4_ = (float)(uVar8 & 0x3f000000 | ~uVar8 & 0xbf000000) - (float)uVar2;
  auVar17._4_4_ = (float)(uVar9 & 0x3f000000 | ~uVar9 & 0xbf000000) - (float)uVar5;
  auVar17._8_8_ = 0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar4;
  auVar14 = divps(auVar17,auVar7);
  fVar12 = auVar14._4_4_;
  if (auVar14._0_4_ <= auVar14._4_4_) {
    fVar12 = auVar14._0_4_;
  }
  fVar1 = (ray->dir).z;
  fVar21 = (ray->origin).z;
  if (fVar1 <= 0.0) {
    fVar18 = 0.5 - fVar21;
    fVar20 = -0.5;
  }
  else {
    fVar18 = -0.5 - fVar21;
    fVar20 = 0.5;
  }
  fVar16 = 0.0;
  if (fVar15 < fVar18 / fVar1) {
    fVar16 = 1.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar15 = fVar18 / fVar1;
  }
  fVar21 = (fVar20 - fVar21) / fVar1;
  if (fVar12 <= fVar21) {
    fVar21 = fVar12;
  }
  bVar19 = fVar15 <= fVar21 && 0.0 < fVar15;
  if (bVar19) {
    uVar3 = (ray->origin).x;
    uVar6 = (ray->origin).y;
    fVar12 = (ray->origin).z;
    result->hit = true;
    (result->p).x = (float)uVar3 + (float)(undefined4)uVar4 * fVar15;
    (result->p).y = (float)uVar6 + (float)uVar4._4_4_ * fVar15;
    (result->p).z = fVar1 * fVar15 + fVar12;
    (result->Ns).x = fVar10;
    (result->Ns).y = fVar11;
    (result->Ns).z = fVar16;
    (result->Ng).x = fVar10;
    (result->Ng).y = fVar11;
    (result->Ng).z = fVar16;
    (result->uv).x = 0.0;
    (result->uv).y = 0.0;
    (result->dpdu).x = 0.0;
    (result->dpdu).y = 0.0;
    *(undefined8 *)&(result->dpdu).z = 0;
    (result->dpdv).y = 0.0;
    (result->dpdv).z = 0.0;
  }
  return bVar19;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		float tmin, tmax;
		vec3f resN = vec3f(1,0,0);

		if (ray.dir.x > 0) {
			tmin = (x1 - ray.origin.x) / ray.dir.x;
			tmax = (x2 - ray.origin.x) / ray.dir.x;
		}
		else {
			tmin = (x2 - ray.origin.x) / ray.dir.x;
			tmax = (x1 - ray.origin.x) / ray.dir.x;
		}
		if (ray.dir.y > 0) {
			float tminy = (y1 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y2 - ray.origin.y) / ray.dir.y);
		}
		else {
			float tminy = (y2 - ray.origin.y) / ray.dir.y;
			if (tminy > tmin) {
				tmin = tminy;
				resN = vec3f(0,1,0);
			}
			tmax = std::min(tmax, (y1 - ray.origin.y) / ray.dir.y);
		}
		if (ray.dir.z > 0) {
			float tminz = (z1 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z2 - ray.origin.z) / ray.dir.z);
		}
		else {
			float tminz = (z2 - ray.origin.z) / ray.dir.z;
			if (tminz > tmin) {
				tmin = tminz;
				resN = vec3f(0,0,1);
			}
			tmax = std::min(tmax, (z1 - ray.origin.z) / ray.dir.z);
		}
		if (0<tmin && tmin <= tmax)
		{
			*result = Hit(ray.atParam(tmin), resN, resN, 0); // TODO Cube texture
			return true;
		}
		return false;
	}